

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_rotate_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 pTVar1;
  TCGv_i32 X_00;
  TCGv_i32 ea_result;
  TCGv_i32 X;
  int left;
  TCGv_i32 shift;
  TCGv_i32 addr;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  addr = gen_ea(env,s,insn,1,((TCGContext_conflict2 *)src)->NULL_QREG,&shift,EA_LOADU,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (addr == *(TCGv_i32 *)(src + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    pTVar1 = tcg_const_i32_m68k((TCGContext_conflict2 *)src,1);
    if ((tcg_ctx._6_2_ & 0x200) == 0) {
      X_00 = rotate_x((TCGContext_conflict2 *)src,addr,pTVar1,insn & 0x100,0x10);
      rotate_x_flags((TCGContext_conflict2 *)src,addr,X_00,0x10);
      tcg_temp_free_i32((TCGContext_conflict2 *)src,X_00);
    }
    else {
      rotate((TCGContext_conflict2 *)src,addr,pTVar1,insn & 0x100,0x10);
    }
    tcg_temp_free_i32((TCGContext_conflict2 *)src,pTVar1);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,1,addr,&shift,EA_STORE
                    ,(uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(src + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      set_cc_op(pDStack_18,CC_OP_FLAGS);
    }
  }
  return;
}

Assistant:

DISAS_INSN(rotate_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr;
    TCGv shift;
    int left = (insn & 0x100);

    SRC_EA(env, src, OS_WORD, 0, &addr);

    shift = tcg_const_i32(tcg_ctx, 1);
    if (insn & 0x0200) {
        rotate(tcg_ctx, src, shift, left, 16);
    } else {
        TCGv X = rotate_x(tcg_ctx, src, shift, left, 16);
        rotate_x_flags(tcg_ctx, src, X, 16);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, shift);
    DEST_EA(env, insn, OS_WORD, src, &addr);
    set_cc_op(s, CC_OP_FLAGS);
}